

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

bool __thiscall
diligent_spirv_cross::CompilerGLSL::can_use_io_location
          (CompilerGLSL *this,StorageClass storage,bool block)

{
  bool bVar1;
  ExecutionModel EVar2;
  uint uVar3;
  
  EVar2 = Compiler::get_execution_model(&this->super_Compiler);
  if ((storage == Input) && (EVar2 != ExecutionModelVertex)) {
LAB_0073d2ac:
    bVar1 = (this->options).es;
    if (bVar1 == false) {
      uVar3 = 0x19a;
      if (block) {
        uVar3 = 0x1b8;
      }
      if ((uVar3 <= (this->options).version) || ((this->options).separate_shader_objects == true))
      goto LAB_0073d2db;
    }
    else {
LAB_0073d2db:
      if ((bVar1 == false) || (0x135 < (this->options).version)) goto LAB_0073d2eb;
    }
LAB_0073d35e:
    bVar1 = false;
  }
  else {
    EVar2 = Compiler::get_execution_model(&this->super_Compiler);
    if ((storage == Output) && (EVar2 != ExecutionModelFragment)) goto LAB_0073d2ac;
LAB_0073d2eb:
    EVar2 = Compiler::get_execution_model(&this->super_Compiler);
    if (EVar2 == ExecutionModelVertex && storage == Input) {
LAB_0073d313:
      uVar3 = 0x149;
      if ((this->options).es != false) {
        uVar3 = 299;
      }
      if ((this->options).version <= uVar3) goto LAB_0073d35e;
    }
    else {
      EVar2 = Compiler::get_execution_model(&this->super_Compiler);
      if (storage == Output && EVar2 == ExecutionModelFragment) goto LAB_0073d313;
    }
    if ((storage < AtomicCounter) && ((0x205U >> (storage & 0x1f) & 1) != 0)) {
      uVar3 = 0x1ad;
      if ((this->options).es != false) {
        uVar3 = 0x135;
      }
      if ((this->options).version <= uVar3) goto LAB_0073d35e;
    }
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool CompilerGLSL::can_use_io_location(StorageClass storage, bool block)
{
	// Location specifiers are must have in SPIR-V, but they aren't really supported in earlier versions of GLSL.
	// Be very explicit here about how to solve the issue.
	if ((get_execution_model() != ExecutionModelVertex && storage == StorageClassInput) ||
	    (get_execution_model() != ExecutionModelFragment && storage == StorageClassOutput))
	{
		uint32_t minimum_desktop_version = block ? 440 : 410;
		// ARB_enhanced_layouts vs ARB_separate_shader_objects ...

		if (!options.es && options.version < minimum_desktop_version && !options.separate_shader_objects)
			return false;
		else if (options.es && options.version < 310)
			return false;
	}

	if ((get_execution_model() == ExecutionModelVertex && storage == StorageClassInput) ||
	    (get_execution_model() == ExecutionModelFragment && storage == StorageClassOutput))
	{
		if (options.es && options.version < 300)
			return false;
		else if (!options.es && options.version < 330)
			return false;
	}

	if (storage == StorageClassUniform || storage == StorageClassUniformConstant || storage == StorageClassPushConstant)
	{
		if (options.es && options.version < 310)
			return false;
		else if (!options.es && options.version < 430)
			return false;
	}

	return true;
}